

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDD.cpp
# Opt level: O1

bool __thiscall
HDD::Copy(HDD *this,HDD *phSrc_,int64_t uSectors_,int64_t uSrcOffset_,int64_t uDstOffset_,
         int64_t uTotal_,char *pcszAction_)

{
  long lVar1;
  uint8_t *__buf;
  long lVar2;
  int iVar3;
  int64_t uPos;
  long lVar4;
  int iVar5;
  int iVar6;
  char *local_70;
  char *local_68;
  long local_60;
  HDD *local_58;
  int64_t local_50;
  int64_t local_48;
  char *local_40;
  ulong local_38;
  
  local_58 = phSrc_;
  local_48 = uSrcOffset_;
  __buf = AllocMem(this->sector_size << 0xb);
  if (uTotal_ == 0) {
    uTotal_ = uSectors_;
  }
  local_40 = "Copying";
  if (pcszAction_ != (char *)0x0) {
    local_40 = pcszAction_;
  }
  lVar4 = 0;
  local_60 = uSectors_;
  local_50 = uDstOffset_;
  local_38 = uTotal_;
  do {
    lVar1 = local_60;
    if (local_58 != (HDD *)0x0) {
      lseek64(local_58->h,
              (long)local_58->data_offset + (long)local_58->sector_size * (local_48 + lVar4),0);
    }
    lseek64(this->h,(long)this->data_offset + (long)this->sector_size * (uDstOffset_ + lVar4),0);
    if (lVar1 <= lVar4) {
      lVar4 = lVar1;
    }
    iVar6 = (int)lVar1 - (int)lVar4;
    iVar3 = iVar6;
    if (0x7ff < iVar6) {
      iVar3 = 0x800;
    }
    local_68 = local_40;
    lVar1 = uDstOffset_ + lVar4;
    local_70 = (char *)CONCAT44(local_70._4_4_,(int)((ulong)(lVar1 * 100) / local_38));
    Message<char_const*,int>(msgStatus,"%s... %d%%",&local_68,(int *)&local_70);
    if (iVar6 != 0) {
      iVar5 = iVar3;
      if (local_58 != (HDD *)0x0) {
        lVar2 = read(local_58->h,__buf,(ulong)(uint)(local_58->sector_size * iVar3));
        if (lVar2 < 1) {
          lVar2 = 0;
        }
        iVar5 = (int)(lVar2 / (long)local_58->sector_size);
      }
      if (iVar5 != iVar3) {
        local_68 = (char *)(local_48 + lVar4 + (long)iVar5);
        local_70 = LastError();
        Message<long,char_const*>
                  (msgStatus,"Read error at sector %lu: %s",(long *)&local_68,&local_70);
        memset(__buf + (long)iVar5 * (long)this->sector_size,0,(long)this->sector_size);
        iVar5 = iVar5 + 1;
      }
      if (opt.byteswap != 0) {
        ByteSwap(__buf,(long)iVar5 * (long)this->sector_size);
      }
      lVar2 = write(this->h,__buf,(ulong)(uint)(this->sector_size * iVar5));
      if (lVar2 < 1) {
        lVar2 = 0;
      }
      iVar3 = (int)(lVar2 / (long)this->sector_size);
      uDstOffset_ = local_50;
      if (iVar5 != iVar3) {
        local_68 = (char *)(iVar3 + lVar1);
        local_70 = LastError();
        uDstOffset_ = local_50;
        Message<long,char_const*>
                  (msgStatus,"Write error at sector %lu: %s",(long *)&local_68,&local_70);
        iVar3 = iVar3 + 1;
      }
      lVar4 = lVar4 + iVar3;
    }
  } while (iVar6 != 0);
  FreeMem(__buf);
  return true;
}

Assistant:

bool HDD::Copy(HDD* phSrc_, int64_t uSectors_, int64_t uSrcOffset_/*=0*/, int64_t uDstOffset_/*=0*/, int64_t uTotal_/*=0*/, const char* pcszAction_)
{
    MEMORY mem(SECTOR_BLOCK * sector_size);

    if (!uTotal_) uTotal_ = uSectors_;

    for (int64_t uPos = 0;;)
    {
        // Sync source and destinations
        if (phSrc_) phSrc_->Seek(uSrcOffset_ + uPos);
        Seek(uDstOffset_ + uPos);

        // Determine how much to transfer in one go
        if (uPos > uSectors_) uPos = uSectors_;
        auto uBlock = std::min(static_cast<int>(uSectors_ - uPos), SECTOR_BLOCK);

        Message(msgStatus, "%s... %d%%", pcszAction_ ? pcszAction_ : "Copying",
            static_cast<int>((static_cast<uint64_t>(uDstOffset_ + uPos) * 100 / uTotal_)));

        if (!uBlock)
            break;

        // Read from source disk
        auto uRead = phSrc_ ? phSrc_->Read(mem, uBlock) : uBlock;
        if (uRead != uBlock)
        {
            Message(msgStatus, "Read error at sector %lu: %s", uSrcOffset_ + uPos + uRead, LastError());

            // Clear the bad block, but include it in the read data
            memset(mem + (uRead * sector_size), 0, sector_size);
            ++uRead;
        }

        // Forced byte-swapping?
        if (opt.byteswap)
            ByteSwap(mem, uRead * sector_size);

        // Write to target disk
        auto uWritten = Write(mem, uRead);
        if (uWritten != uRead)
        {
            Message(msgStatus, "Write error at sector %lu: %s", uDstOffset_ + uPos + uWritten, LastError());

            // Skip past the write error
            ++uWritten;
        }

        // Advance by the amount written
        uPos += uWritten;
    }

    return true;
}